

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZQuadSphere.h
# Opt level: O1

void __thiscall
pzgeom::TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>>::GradX<Fad<double>>
          (TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>> *this,TPZFMatrix<double> *coord,
          TPZVec<Fad<double>_> *param,TPZFMatrix<Fad<double>_> *gradx)

{
  uint uVar1;
  uint uVar2;
  double *pdVar3;
  int iVar4;
  TPZFMatrix<double> *coord_00;
  TPZVec<Fad<double>_> *pTVar5;
  undefined4 uVar6;
  double *pdVar7;
  Fad<double> **ppFVar8;
  TPZFMatrix<Fad<double>_> *vec2;
  long lVar9;
  Fad<double> *pFVar10;
  ulong uVar11;
  int i;
  long lVar12;
  int i_3;
  Fad<double> *pFVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  Fad<double> zero;
  Fad<double> phi;
  TPZFNMatrix<9,_Fad<double>_> gradv;
  TPZManVector<Fad<double>,_3> xqsiLxc;
  TPZFNMatrix<3,_Fad<double>_> v;
  TPZFNMatrix<3,_Fad<double>_> gradphi;
  TPZManVector<Fad<double>,_3> xqsi;
  TPZFNMatrix<9,_Fad<double>_> DphivDx;
  TPZFNMatrix<6,_Fad<double>_> dxdqsi;
  Fad<double> local_ac8;
  Fad<double> local_aa8;
  Fad<double> local_a88;
  TPZFMatrix<double> *local_a68;
  Fad<double> local_a60;
  Fad<double> local_a40;
  TPZFMatrix<Fad<double>_> *local_a20;
  TPZVec<Fad<double>_> *local_a18;
  undefined1 local_a10 [24];
  double *pdStack_9f8;
  Fad<double> *local_9f0 [54];
  undefined1 local_840 [144];
  TPZManVector<Fad<double>,_3> local_7b0;
  TPZFMatrix<Fad<double>_> local_730;
  TPZFMatrix<Fad<double>_> local_6a0;
  TPZFNMatrix<3,_Fad<double>_> local_610;
  TPZFNMatrix<3,_Fad<double>_> local_500;
  TPZManVector<Fad<double>,_3> local_3f0;
  undefined1 local_370 [464];
  TPZFNMatrix<6,_Fad<double>_> local_1a0;
  
  local_a10._0_8_ = (Fad<double> *)0x0;
  local_a10._8_8_ = local_a10._8_8_ & 0xffffffff00000000;
  local_a10._16_8_ = (double *)0x0;
  pdStack_9f8 = (double *)0x0;
  local_a20 = gradx;
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_3f0,3,(Fad<double> *)local_a10);
  Fad<double>::~Fad((Fad<double> *)local_a10);
  local_a10._0_8_ = (Fad<double> *)0x0;
  local_a10._8_8_ = local_a10._8_8_ & 0xffffffff00000000;
  local_a10._16_8_ = (double *)0x0;
  pdStack_9f8 = (double *)0x0;
  TPZManVector<Fad<double>,_3>::TPZManVector(&local_7b0,3,(Fad<double> *)local_a10);
  Fad<double>::~Fad((Fad<double> *)local_a10);
  local_a68 = coord;
  local_a18 = param;
  TPZGeoBlend<pzgeom::TPZGeoQuad>::X<Fad<double>>
            ((TPZGeoBlend<pzgeom::TPZGeoQuad> *)this,coord,param,
             &local_3f0.super_TPZVec<Fad<double>_>);
  local_ac8.val_ = 0.0;
  local_ac8.dx_.num_elts = 0;
  local_ac8.dx_.ptr_to_data = (double *)0x0;
  local_ac8.defaultVal = 0.0;
  lVar12 = 0;
  do {
    pFVar10 = local_3f0.super_TPZVec<Fad<double>_>.fStore;
    dVar16 = *(double *)(*(long *)(this + 0xa90) + lVar12 * 8);
    uVar1 = local_3f0.super_TPZVec<Fad<double>_>.fStore[lVar12].dx_.num_elts;
    uVar2 = local_7b0.super_TPZVec<Fad<double>_>.fStore[lVar12].dx_.num_elts;
    pFVar13 = local_7b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    if (uVar1 != uVar2) {
      if (uVar1 == 0) {
        if (uVar2 != 0) {
          pdVar7 = (pFVar13->dx_).ptr_to_data;
          if (pdVar7 != (double *)0x0) {
            operator_delete__(pdVar7);
          }
          (pFVar13->dx_).num_elts = 0;
          (pFVar13->dx_).ptr_to_data = (double *)0x0;
        }
      }
      else {
        if (uVar2 != 0) {
          pdVar7 = (pFVar13->dx_).ptr_to_data;
          if (pdVar7 != (double *)0x0) {
            operator_delete__(pdVar7);
          }
          (pFVar13->dx_).num_elts = 0;
          (pFVar13->dx_).ptr_to_data = (double *)0x0;
        }
        (pFVar13->dx_).num_elts = uVar1;
        uVar11 = (long)(int)uVar1 << 3;
        if ((int)uVar1 < 0) {
          uVar11 = 0xffffffffffffffff;
        }
        pdVar7 = (double *)operator_new__(uVar11);
        (pFVar13->dx_).ptr_to_data = pdVar7;
      }
    }
    pFVar10 = pFVar10 + lVar12;
    if (uVar1 != 0) {
      pdVar7 = (pFVar13->dx_).ptr_to_data;
      if ((pFVar10->dx_).num_elts == 0) {
        if (0 < (int)uVar1) {
          uVar11 = 0;
          do {
            pdVar7[uVar11] = pFVar10->defaultVal;
            uVar11 = uVar11 + 1;
          } while (uVar1 != uVar11);
        }
      }
      else if (0 < (int)uVar1) {
        pdVar3 = (pFVar10->dx_).ptr_to_data;
        uVar11 = 0;
        do {
          pdVar7[uVar11] = pdVar3[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar1 != uVar11);
      }
    }
    pFVar13->val_ = pFVar10->val_ - dVar16;
    local_a10._0_8_ = local_7b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_a10._8_8_ = local_a10._0_8_;
    Fad<double>::operator+=
              (&local_ac8,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)local_a10);
    lVar12 = lVar12 + 1;
  } while (lVar12 != 3);
  FadFuncSqrt<Fad<double>_>::FadFuncSqrt((FadFuncSqrt<Fad<double>_> *)local_370,&local_ac8);
  FadExpr<FadFuncSqrt<Fad<double>_>_>::FadExpr
            ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)local_a10,(FadFuncSqrt<Fad<double>_> *)local_370
            );
  Fad<double>::~Fad((Fad<double> *)local_370);
  uVar6 = local_a10._16_4_;
  uVar11 = local_a10._16_8_ & 0xffffffff;
  if (local_a10._16_4_ != local_ac8.dx_.num_elts) {
    if (local_a10._16_4_ == 0) {
      if (local_ac8.dx_.num_elts != 0) {
        if (local_ac8.dx_.ptr_to_data != (double *)0x0) {
          operator_delete__(local_ac8.dx_.ptr_to_data);
        }
        local_ac8.dx_.num_elts = 0;
        local_ac8.dx_.ptr_to_data = (double *)0x0;
      }
    }
    else {
      lVar12 = (long)(int)local_a10._16_4_;
      if (local_ac8.dx_.num_elts != 0) {
        if (local_ac8.dx_.ptr_to_data != (double *)0x0) {
          operator_delete__(local_ac8.dx_.ptr_to_data);
        }
        local_ac8.dx_.ptr_to_data = (double *)0x0;
      }
      local_ac8.dx_.num_elts = uVar6;
      uVar14 = 0xffffffffffffffff;
      if (-1 < (int)uVar6) {
        uVar14 = lVar12 << 3;
      }
      local_ac8.dx_.ptr_to_data = (double *)operator_new__(uVar14);
    }
  }
  pdVar7 = local_ac8.dx_.ptr_to_data;
  if (uVar6 != 0) {
    if (local_a10._16_4_ == 0) {
      if (0 < (int)uVar6) {
        lVar12 = 0;
        do {
          ppFVar8 = (Fad<double> **)((long)pdStack_9f8 + lVar12);
          if (local_a10._16_4_ == 0) {
            ppFVar8 = local_9f0;
          }
          pFVar10 = *ppFVar8;
          if ((double)local_a10._8_8_ < 0.0) {
            dVar16 = sqrt((double)local_a10._8_8_);
          }
          else {
            dVar16 = SQRT((double)local_a10._8_8_);
          }
          *(double *)((long)pdVar7 + lVar12) = (double)pFVar10 / (dVar16 + dVar16);
          lVar12 = lVar12 + 8;
        } while (uVar11 * 8 - lVar12 != 0);
      }
    }
    else if (0 < (int)uVar6) {
      uVar14 = 0;
      do {
        dVar16 = pdStack_9f8[uVar14];
        if ((double)local_a10._8_8_ < 0.0) {
          dVar15 = sqrt((double)local_a10._8_8_);
        }
        else {
          dVar15 = SQRT((double)local_a10._8_8_);
        }
        pdVar7[uVar14] = dVar16 / (dVar15 + dVar15);
        uVar14 = uVar14 + 1;
      } while (uVar11 != uVar14);
    }
  }
  if ((double)local_a10._8_8_ < 0.0) {
    local_ac8.val_ = sqrt((double)local_a10._8_8_);
  }
  else {
    local_ac8.val_ = SQRT((double)local_a10._8_8_);
  }
  coord_00 = local_a68;
  Fad<double>::~Fad((Fad<double> *)(local_a10 + 8));
  local_a10._0_8_ = (Fad<double> *)0x0;
  local_a10._8_8_ = local_a10._8_8_ & 0xffffffff00000000;
  local_a10._16_8_ = (double *)0x0;
  pdStack_9f8 = (double *)0x0;
  TPZFNMatrix<6,_Fad<double>_>::TPZFNMatrix(&local_1a0,3,2,(Fad<double> *)local_a10);
  Fad<double>::~Fad((Fad<double> *)local_a10);
  pTVar5 = local_a18;
  TPZGeoBlend<pzgeom::TPZGeoQuad>::GradX<Fad<double>>
            ((TPZGeoBlend<pzgeom::TPZGeoQuad> *)this,coord_00,local_a18,
             &local_1a0.super_TPZFMatrix<Fad<double>_>);
  local_a10._0_8_ = (Fad<double> *)0x0;
  local_a10._8_8_ = local_a10._8_8_ & 0xffffffff00000000;
  local_a10._16_8_ = (double *)0x0;
  pdStack_9f8 = (double *)0x0;
  TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix(&local_500,3,1,(Fad<double> *)local_a10);
  Fad<double>::~Fad((Fad<double> *)local_a10);
  local_a10._0_8_ = (Fad<double> *)0x0;
  local_a10._8_8_ = local_a10._8_8_ & 0xffffffff00000000;
  local_a10._16_8_ = (double *)0x0;
  pdStack_9f8 = (double *)0x0;
  TPZFNMatrix<3,_Fad<double>_>::TPZFNMatrix(&local_610,3,1,(Fad<double> *)local_a10);
  Fad<double>::~Fad((Fad<double> *)local_a10);
  pFVar10 = pTVar5->fStore;
  local_aa8.val_ = pFVar10->val_ - pFVar10->val_;
  uVar1 = (pFVar10->dx_).num_elts;
  local_aa8.dx_.num_elts = 0;
  local_aa8.dx_.ptr_to_data = (double *)0x0;
  if (0 < (long)(int)uVar1) {
    local_aa8.dx_.num_elts = uVar1;
    local_aa8.dx_.ptr_to_data = (double *)operator_new__((long)(int)uVar1 << 3);
  }
  local_aa8.defaultVal = 0.0;
  lVar12 = (long)(pFVar10->dx_).num_elts;
  if (0 < lVar12) {
    lVar9 = 0;
    do {
      dVar16 = (pFVar10->dx_).ptr_to_data[lVar9];
      local_aa8.dx_.ptr_to_data[lVar9] = dVar16 - dVar16;
      lVar9 = lVar9 + 1;
    } while (lVar12 != lVar9);
  }
  TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
            ((TPZFNMatrix<9,_Fad<double>_> *)local_a10,3,3,&local_aa8);
  iVar4 = local_ac8.dx_.num_elts;
  local_a88.val_ = 1.0 / local_ac8.val_;
  lVar12 = (long)local_ac8.dx_.num_elts;
  local_a88.dx_.num_elts = 0;
  local_a88.dx_.ptr_to_data = (double *)0x0;
  if (0 < lVar12) {
    local_a88.dx_.num_elts = local_ac8.dx_.num_elts;
    local_a88.dx_.ptr_to_data = (double *)operator_new__(lVar12 * 8);
  }
  local_a88.defaultVal = 0.0;
  if (0 < iVar4) {
    lVar9 = 0;
    do {
      *(double *)((long)local_a88.dx_.ptr_to_data + lVar9 * 8) =
           -local_ac8.dx_.ptr_to_data[lVar9] / (local_ac8.val_ * local_ac8.val_);
      lVar9 = lVar9 + 1;
    } while (lVar12 != lVar9);
  }
  lVar12 = 0;
  while( true ) {
    pFVar10 = local_7b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    dVar16 = *(double *)(this + 0xa80);
    if ((local_610.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
         fRow <= lVar12) ||
       (local_610.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
        fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    uVar1 = (pFVar10->dx_).num_elts;
    uVar2 = local_610.super_TPZFMatrix<Fad<double>_>.fElem[lVar12].dx_.num_elts;
    pFVar13 = local_610.super_TPZFMatrix<Fad<double>_>.fElem + lVar12;
    if (uVar1 != uVar2) {
      if (uVar1 == 0) {
        if (uVar2 != 0) {
          pdVar7 = (pFVar13->dx_).ptr_to_data;
          if (pdVar7 != (double *)0x0) {
            operator_delete__(pdVar7);
          }
          (pFVar13->dx_).num_elts = 0;
          (pFVar13->dx_).ptr_to_data = (double *)0x0;
        }
      }
      else {
        if (uVar2 != 0) {
          pdVar7 = (pFVar13->dx_).ptr_to_data;
          if (pdVar7 != (double *)0x0) {
            operator_delete__(pdVar7);
          }
          (pFVar13->dx_).num_elts = 0;
          (pFVar13->dx_).ptr_to_data = (double *)0x0;
        }
        (pFVar13->dx_).num_elts = uVar1;
        uVar11 = (long)(int)uVar1 << 3;
        if ((int)uVar1 < 0) {
          uVar11 = 0xffffffffffffffff;
        }
        pdVar7 = (double *)operator_new__(uVar11);
        (pFVar13->dx_).ptr_to_data = pdVar7;
      }
    }
    iVar4 = local_aa8.dx_.num_elts;
    if (uVar1 != 0) {
      pdVar7 = (pFVar13->dx_).ptr_to_data;
      if ((pFVar10->dx_).num_elts == 0) {
        if (0 < (int)uVar1) {
          uVar11 = 0;
          do {
            pdVar7[uVar11] = pFVar10->defaultVal * dVar16;
            uVar11 = uVar11 + 1;
          } while (uVar1 != uVar11);
        }
      }
      else if (0 < (int)uVar1) {
        pdVar3 = (pFVar10->dx_).ptr_to_data;
        uVar11 = 0;
        do {
          pdVar7[uVar11] = pdVar3[uVar11] * dVar16;
          uVar11 = uVar11 + 1;
        } while (uVar1 != uVar11);
      }
    }
    pFVar13->val_ = dVar16 * pFVar10->val_;
    dVar16 = *(double *)(this + 0xa80);
    if (((long)local_a10._8_8_ <= lVar12) || ((long)local_a10._16_8_ <= lVar12)) break;
    uVar11 = (ulong)(uint)local_aa8.dx_.num_elts;
    uVar1 = local_9f0[0][local_a10._8_8_ * lVar12 + lVar12].dx_.num_elts;
    pFVar10 = local_9f0[0] + local_a10._8_8_ * lVar12 + lVar12;
    if (local_aa8.dx_.num_elts != uVar1) {
      if (local_aa8.dx_.num_elts == 0) {
        if (uVar1 != 0) {
          pdVar7 = (pFVar10->dx_).ptr_to_data;
          if (pdVar7 != (double *)0x0) {
            operator_delete__(pdVar7);
          }
          (pFVar10->dx_).num_elts = 0;
          (pFVar10->dx_).ptr_to_data = (double *)0x0;
        }
      }
      else {
        if (uVar1 != 0) {
          pdVar7 = (pFVar10->dx_).ptr_to_data;
          if (pdVar7 != (double *)0x0) {
            operator_delete__(pdVar7);
          }
          (pFVar10->dx_).num_elts = 0;
          (pFVar10->dx_).ptr_to_data = (double *)0x0;
        }
        (pFVar10->dx_).num_elts = iVar4;
        uVar14 = (long)iVar4 << 3;
        if (iVar4 < 0) {
          uVar14 = 0xffffffffffffffff;
        }
        pdVar7 = (double *)operator_new__(uVar14);
        (pFVar10->dx_).ptr_to_data = pdVar7;
      }
    }
    if (iVar4 != 0) {
      pdVar7 = (pFVar10->dx_).ptr_to_data;
      if (local_aa8.dx_.num_elts == 0) {
        if (0 < iVar4) {
          uVar14 = 0;
          do {
            pdVar7[uVar14] = local_aa8.defaultVal;
            uVar14 = uVar14 + 1;
          } while (uVar11 != uVar14);
        }
      }
      else if (0 < iVar4) {
        uVar14 = 0;
        do {
          pdVar7[uVar14] = local_aa8.dx_.ptr_to_data[uVar14];
          uVar14 = uVar14 + 1;
        } while (uVar11 != uVar14);
      }
    }
    pFVar10->val_ = dVar16 + local_aa8.val_;
    local_730.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&local_ac8;
    local_6a0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&local_730;
    local_370._8_8_ = 0x3ff0000000000000;
    local_370._16_8_ = (double *)0x0;
    local_370._24_8_ = &local_6a0;
    local_a40.val_ = (double)local_370;
    local_840._8_8_ = local_7b0.super_TPZVec<Fad<double>_>.fStore + lVar12;
    local_840._0_8_ = &local_a40;
    local_730.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow =
         (int64_t)local_730.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable;
    local_6a0.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.fRow =
         (int64_t)local_730.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable;
    if ((local_500.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
         fRow <= lVar12) ||
       (local_500.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
        fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (local_500.super_TPZFMatrix<Fad<double>_>.fElem + lVar12,
               (FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_Fad<double>_>_>
                *)local_840);
    lVar12 = lVar12 + 1;
    if (lVar12 == 3) {
      vec2 = (TPZFMatrix<Fad<double>_> *)local_840;
      local_840._0_8_ =
           (FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>
            *)0x0;
      local_840._8_8_ = local_840._8_8_ & 0xffffffff00000000;
      local_840._16_8_ = (double *)0x0;
      local_840._24_8_ = 0.0;
      TPZFNMatrix<9,_Fad<double>_>::TPZFNMatrix
                ((TPZFNMatrix<9,_Fad<double>_> *)local_370,3,3,(Fad<double> *)vec2);
      Fad<double>::~Fad((Fad<double> *)local_840);
      TensorProd<Fad<double>>
                (&local_6a0,(TPZQuadSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoQuad>> *)&local_610,
                 &local_500.super_TPZFMatrix<Fad<double>_>,vec2);
      iVar4 = local_a88.dx_.num_elts;
      local_a60.val_ = local_a88.val_;
      local_a60.dx_.num_elts = local_a88.dx_.num_elts;
      local_a60.dx_.ptr_to_data = (double *)0x0;
      if ((long)local_a88.dx_.num_elts != 0) {
        uVar11 = 0xffffffffffffffff;
        if (-1 < local_a88.dx_.num_elts) {
          uVar11 = (long)local_a88.dx_.num_elts * 8;
        }
        local_a60.dx_.ptr_to_data = (double *)operator_new__(uVar11);
        MEM_CPY<double>::copy
                  ((MEM_CPY<double> *)local_a60.dx_.ptr_to_data,
                   (EVP_PKEY_CTX *)local_a88.dx_.ptr_to_data,(EVP_PKEY_CTX *)(ulong)(uint)iVar4);
      }
      iVar4 = local_a60.dx_.num_elts;
      local_a60.defaultVal = local_a88.defaultVal;
      local_a40.val_ = local_a60.val_;
      local_a40.dx_.num_elts = local_a60.dx_.num_elts;
      local_a40.dx_.ptr_to_data = (double *)0x0;
      if ((long)local_a60.dx_.num_elts != 0) {
        uVar11 = 0xffffffffffffffff;
        if (-1 < local_a60.dx_.num_elts) {
          uVar11 = (long)local_a60.dx_.num_elts * 8;
        }
        local_a40.dx_.ptr_to_data = (double *)operator_new__(uVar11);
        MEM_CPY<double>::copy
                  ((MEM_CPY<double> *)local_a40.dx_.ptr_to_data,
                   (EVP_PKEY_CTX *)local_a60.dx_.ptr_to_data,(EVP_PKEY_CTX *)(ulong)(uint)iVar4);
      }
      local_a40.defaultVal = local_a60.defaultVal;
      TPZFMatrix<Fad<double>_>::operator*
                (&local_730,(TPZFMatrix<Fad<double>_> *)local_a10,&local_a40);
      Fad<double>::~Fad(&local_a40);
      TPZFMatrix<Fad<double>_>::operator+
                ((TPZFMatrix<Fad<double>_> *)local_840,&local_6a0,&local_730);
      TPZFMatrix<Fad<double>_>::operator=
                ((TPZFMatrix<Fad<double>_> *)local_370,(TPZFMatrix<Fad<double>_> *)local_840);
      TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)local_840);
      TPZFMatrix<Fad<double>_>::~TPZFMatrix(&local_730);
      Fad<double>::~Fad(&local_a60);
      TPZFMatrix<Fad<double>_>::~TPZFMatrix(&local_6a0);
      TPZMatrix<Fad<double>_>::Multiply
                ((TPZMatrix<Fad<double>_> *)local_370,&local_1a0.super_TPZFMatrix<Fad<double>_>,
                 local_a20,0);
      local_370._0_8_ = &PTR__TPZFNMatrix_018770f8;
      lVar12 = 0x1b0;
      do {
        Fad<double>::~Fad((Fad<double> *)(local_370 + lVar12));
        lVar12 = lVar12 + -0x20;
      } while (lVar12 != 0x70);
      TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)local_370,&PTR_PTR_018773b0)
      ;
      Fad<double>::~Fad(&local_a88);
      local_a10._0_8_ = &PTR__TPZFNMatrix_018770f8;
      lVar12 = 0x1b0;
      do {
        Fad<double>::~Fad((Fad<double> *)(local_a10 + lVar12));
        lVar12 = lVar12 + -0x20;
      } while (lVar12 != 0x70);
      TPZFMatrix<Fad<double>_>::~TPZFMatrix((TPZFMatrix<Fad<double>_> *)local_a10,&PTR_PTR_018773b0)
      ;
      Fad<double>::~Fad(&local_aa8);
      local_610.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_01877ab8;
      lVar12 = 0xf0;
      do {
        Fad<double>::~Fad((Fad<double> *)
                          ((long)&((TPZFMatrix<Fad<double>_> *)
                                  (&((TPZFMatrix<Fad<double>_> *)
                                    (&local_610.super_TPZFMatrix<Fad<double>_>.fPivot + -1))->fPivot
                                  + -1))->fPivot + lVar12 + 0xffffffffffffffc8U));
        lVar12 = lVar12 + -0x20;
      } while (lVar12 != 0x70);
      TPZFMatrix<Fad<double>_>::~TPZFMatrix
                (&local_610.super_TPZFMatrix<Fad<double>_>,&PTR_PTR_01877d70);
      local_500.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_01877ab8;
      lVar12 = 0xf0;
      do {
        Fad<double>::~Fad((Fad<double> *)
                          ((long)&((TPZFMatrix<Fad<double>_> *)
                                  (&((TPZFMatrix<Fad<double>_> *)
                                    (&local_500.super_TPZFMatrix<Fad<double>_>.fPivot + -1))->fPivot
                                  + -1))->fPivot + lVar12 + 0xffffffffffffffc8U));
        lVar12 = lVar12 + -0x20;
      } while (lVar12 != 0x70);
      TPZFMatrix<Fad<double>_>::~TPZFMatrix
                (&local_500.super_TPZFMatrix<Fad<double>_>,&PTR_PTR_01877d70);
      local_1a0.super_TPZFMatrix<Fad<double>_>.super_TPZMatrix<Fad<double>_>.super_TPZBaseMatrix.
      super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZFNMatrix_018b1028;
      lVar12 = 0x150;
      do {
        Fad<double>::~Fad((Fad<double> *)
                          ((long)&((TPZFMatrix<Fad<double>_> *)
                                  (&((TPZFMatrix<Fad<double>_> *)
                                    (&local_1a0.super_TPZFMatrix<Fad<double>_>.fPivot + -1))->fPivot
                                  + -1))->fPivot + lVar12 + 0xffffffffffffffc8U));
        lVar12 = lVar12 + -0x20;
      } while (lVar12 != 0x70);
      TPZFMatrix<Fad<double>_>::~TPZFMatrix
                (&local_1a0.super_TPZFMatrix<Fad<double>_>,&PTR_PTR_018b12e0);
      Fad<double>::~Fad(&local_ac8);
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_7b0);
      TPZManVector<Fad<double>,_3>::~TPZManVector(&local_3f0);
      return;
    }
  }
  TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void GradX(TPZFMatrix<REAL> &coord, TPZVec<T> &param, TPZFMatrix<T> &gradx) const
        {
            // will first do dxdqsi and then d(phi*v)/dx, finaly d(phi*v)/dx * dxdqsi, where phi = 1/norm(xqsi - xc) and v = (xqsi - xc) * fR
            
            TPZManVector<T,3> xqsi(3,0.); // will store (x,y,z) from (qsi,eta)
            TPZManVector<T,3> xqsiLxc(3,0.); // will store (x,y,z)-xc
            GeomQuad::X(coord,param,xqsi); // gives the map (qsi,eta) to (x,y,z)
            T norm = 0.;
            for (int i = 0; i < 3; i++) { // Does xqsi-xc and calculates its norm
                xqsiLxc[i] = xqsi[i] - fxc[i];
                norm += xqsiLxc[i] * xqsiLxc[i];
            }
            norm = sqrt(norm);
            
            TPZFNMatrix<6,T> dxdqsi(3,2,0.); // But it is a (3,2) matrix. It is set (3,3) because of the later products
            GeomQuad::GradX(coord,param,dxdqsi);
            
            TPZFNMatrix<3,T> gradphi(3,1,0.), v(3,1,0.); // here phi = 1/norm(xqsi - xc) and v = (xqsi - xc) * fR
            T zero = param[0]-param[0];
            TPZFNMatrix<9,T> gradv(3,3,zero); // here v = (xqsi - xc) * fR
            T phi = 1./norm;
            
            for (int i = 0; i < 3; i++) {
                v(i,0) = xqsiLxc[i] * fR;
                gradv(i,i) = fR+zero;
                gradphi(i,0) = - (1. / (norm*norm*norm) ) * xqsiLxc[i];
            }
            
            TPZFNMatrix <9,T> DphivDx(3,3,0.); // will store d(phi*v)/dx
            DphivDx = TensorProd(v,gradphi) + phi*gradv;
            
            DphivDx.Multiply(dxdqsi, gradx);
        }